

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclaredType.cpp
# Opt level: O0

ASTContext * __thiscall
slang::ast::DeclaredType::getASTContext<false,slang::ast::ASTContext>
          (ASTContext *__return_storage_ptr__,DeclaredType *this)

{
  InstanceSymbol *this_00;
  bool bVar1;
  Symbol *this_01;
  InstanceBodySymbol *pIVar2;
  Scope *pSVar3;
  LookupLocation LVar4;
  LookupLocation lookupLocation;
  LookupLocation local_b8;
  undefined1 local_a8 [8];
  LookupLocation location;
  InstanceSymbol *inst;
  Scope *local_60;
  Scope *scope;
  bitmask<slang::ast::DeclaredTypeFlags> local_4c;
  bitmask<slang::ast::ASTFlags> local_48;
  bitmask<slang::ast::DeclaredTypeFlags> local_3c;
  bitmask<slang::ast::ASTFlags> local_38;
  bitmask<slang::ast::DeclaredTypeFlags> local_2c;
  bitmask<slang::ast::ASTFlags> local_28;
  bitmask<slang::ast::DeclaredTypeFlags> local_1c;
  bitmask<slang::ast::ASTFlags> local_18;
  bitmask<slang::ast::ASTFlags> astFlags;
  DeclaredType *this_local;
  
  astFlags.m_bits = (underlying_type)this;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_18);
  bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_1c,NetType);
  bVar1 = bitmask<slang::ast::DeclaredTypeFlags>::has(&this->flags,&local_1c);
  if (bVar1) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_28,NonProcedural);
    bitmask<slang::ast::ASTFlags>::operator|=(&local_18,&local_28);
  }
  bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_2c,AutomaticInitializer);
  bVar1 = bitmask<slang::ast::DeclaredTypeFlags>::has(&this->flags,&local_2c);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_38,StaticInitializer);
    bitmask<slang::ast::ASTFlags>::operator|=(&local_18,&local_38);
  }
  bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_3c,CoverageType);
  bVar1 = bitmask<slang::ast::DeclaredTypeFlags>::has(&this->flags,&local_3c);
  if (bVar1) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_48,AllowCoverageSampleFormal);
    bitmask<slang::ast::ASTFlags>::operator|=(&local_18,&local_48);
  }
  bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_4c,UserDefinedNetType);
  bVar1 = bitmask<slang::ast::DeclaredTypeFlags>::has(&this->flags,&local_4c);
  if (bVar1) {
    bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&scope,AllowNetType);
    bitmask<slang::ast::ASTFlags>::operator|=(&local_18,(bitmask<slang::ast::ASTFlags> *)&scope);
  }
  local_60 = Symbol::getParentScope(this->parent);
  if (local_60 == (Scope *)0x0) {
    assert::assertFailed
              ("scope",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/types/DeclaredType.cpp"
               ,0x1c6,
               "T slang::ast::DeclaredType::getASTContext() const [IsInitializer = false, T = slang::ast::ASTContext]"
              );
  }
  bitmask<slang::ast::DeclaredTypeFlags>::bitmask
            ((bitmask<slang::ast::DeclaredTypeFlags> *)((long)&inst + 4),TypeOverridden);
  bVar1 = bitmask<slang::ast::DeclaredTypeFlags>::has
                    (&this->flags,(bitmask<slang::ast::DeclaredTypeFlags> *)((long)&inst + 4));
  if (bVar1) {
    this_01 = Scope::asSymbol(local_60);
    pIVar2 = Symbol::as<slang::ast::InstanceBodySymbol>(this_01);
    this_00 = pIVar2->parentInstance;
    if (this_00 == (InstanceSymbol *)0x0) {
      assert::assertFailed
                ("inst",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/types/DeclaredType.cpp"
                 ,0x1ce,
                 "T slang::ast::DeclaredType::getASTContext() const [IsInitializer = false, T = slang::ast::ASTContext]"
                );
    }
    pSVar3 = Symbol::getParentScope((Symbol *)this_00);
    local_60 = pSVar3;
    if (pSVar3 == (Scope *)0x0) {
      assert::assertFailed
                ("scope",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/types/DeclaredType.cpp"
                 ,0x1d1,
                 "T slang::ast::DeclaredType::getASTContext() const [IsInitializer = false, T = slang::ast::ASTContext]"
                );
    }
    LVar4 = LookupLocation::before((Symbol *)this_00);
    location._8_8_ = local_18.m_bits;
    lookupLocation._12_4_ = 0;
    lookupLocation.scope = (Scope *)SUB128(LVar4._0_12_,0);
    lookupLocation.index = SUB124(LVar4._0_12_,8);
    ASTContext::ASTContext(__return_storage_ptr__,pSVar3,lookupLocation,local_18);
  }
  else {
    LookupLocation::LookupLocation((LookupLocation *)local_a8);
    if ((*(uint *)&this->field_0x3c & 0x3fffffff) == 0) {
      LVar4 = LookupLocation::before(this->parent);
      local_a8 = (undefined1  [8])LVar4.scope;
      location.scope._0_4_ = LVar4.index;
    }
    else {
      pSVar3 = Symbol::getParentScope(this->parent);
      LookupLocation::LookupLocation(&local_b8,pSVar3,*(uint *)&this->field_0x3c & 0x3fffffff);
      local_a8 = (undefined1  [8])local_b8.scope;
      location.scope._0_4_ = local_b8.index;
    }
    LVar4.index = (uint32_t)location.scope;
    LVar4.scope = (Scope *)local_a8;
    LVar4._12_4_ = 0;
    ASTContext::ASTContext(__return_storage_ptr__,local_60,LVar4,local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

T DeclaredType::getASTContext() const {
    bitmask<ASTFlags> astFlags;
    if (flags.has(DeclaredTypeFlags::NetType))
        astFlags |= ASTFlags::NonProcedural;
    if (!flags.has(DeclaredTypeFlags::AutomaticInitializer))
        astFlags |= ASTFlags::StaticInitializer;
    if (flags.has(DeclaredTypeFlags::CoverageType))
        astFlags |= ASTFlags::AllowCoverageSampleFormal;
    if (flags.has(DeclaredTypeFlags::UserDefinedNetType))
        astFlags |= ASTFlags::AllowNetType;

    const Scope* scope = parent.getParentScope();
    ASSERT(scope);

    // If this type/initializer has been overridden by a parameter override,
    // we should use the instantiation scope and not the parameter's scope
    // when resolving.
    if ((IsInitializer && flags.has(DeclaredTypeFlags::InitializerOverridden)) ||
        (!IsInitializer && flags.has(DeclaredTypeFlags::TypeOverridden))) {
        auto inst = scope->asSymbol().as<InstanceBodySymbol>().parentInstance;
        ASSERT(inst);

        scope = inst->getParentScope();
        ASSERT(scope);

        return ASTContext(*scope, LookupLocation::before(*inst), astFlags);
    }

    // The location depends on whether we are creating the initializer or the type.
    // Initializer lookup happens *after* the parent symbol, so that it can reference
    // the symbol itself. Type lookup happens *before*, since it can't yet see the
    // symbol declaration. There is an exception for parameters, which also can't
    // see its own declaration (which would result in infinite recursion).
    LookupLocation location;
    if (overrideIndex) {
        location = LookupLocation(parent.getParentScope(), overrideIndex);
    }
    else if (IsInitializer) {
        if (flags.has(DeclaredTypeFlags::InitializerCantSeeParent))
            location = LookupLocation::before(parent);
        else
            location = LookupLocation::after(parent);
    }
    else {
        location = LookupLocation::before(parent);
    }

    return ASTContext(*scope, location, astFlags);
}